

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,VariableExpression *expression)

{
  int index;
  Value *pVVar1;
  Symbol SStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)&expression->variable_name_);
  Symbol::Symbol(&SStack_58,&local_38);
  index = FunctionTable::Get(&this->table_,&SStack_58);
  std::__cxx11::string::~string((string *)&SStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  pVVar1 = FrameEmulator::Get(&this->frame_,index);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar1;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(VariableExpression* expression) {
  int index = table_.Get(Symbol(expression->variable_name_));
  tos_value_ = frame_.Get(index);
}